

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

bitset_container_t * bitset_container_from_run(run_container_t *arr)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  rle16_t *prVar4;
  uint64_t *puVar5;
  ulong uVar6;
  int iVar7;
  bitset_container_t *pbVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  
  iVar7 = run_container_cardinality(arr);
  pbVar8 = bitset_container_create();
  iVar3 = arr->n_runs;
  if (0 < (long)iVar3) {
    prVar4 = arr->runs;
    puVar5 = pbVar8->words;
    lVar12 = 0;
    do {
      uVar1 = prVar4[lVar12].value;
      uVar2 = prVar4[lVar12].length;
      uVar9 = (uint)uVar2 + (uint)uVar1;
      uVar10 = (uint)(uVar1 >> 6);
      uVar11 = uVar9 >> 6;
      if (uVar11 - uVar10 == 0) {
        puVar5[uVar10] =
             puVar5[uVar10] |
             (0xffffffffffffffffU >> (0x3fU - (char)uVar2 & 0x3f)) << ((byte)uVar1 & 0x3f);
      }
      else {
        uVar6 = puVar5[uVar11];
        puVar5[uVar10] = puVar5[uVar10] | -1L << ((byte)uVar1 & 0x3f);
        if (uVar10 + 1 < uVar11) {
          memset(puVar5 + (ulong)(uVar1 >> 6) + 1,0xff,
                 (ulong)((uVar11 - uVar10) - 2 >> 1) * 0x10 + 0x10);
        }
        puVar5[uVar11] = uVar6 | 0xffffffffffffffffU >> (~(byte)uVar9 & 0x3f);
      }
      lVar12 = lVar12 + 1;
    } while (iVar3 != lVar12);
  }
  pbVar8->cardinality = iVar7;
  return pbVar8;
}

Assistant:

bitset_container_t *bitset_container_from_run(const run_container_t *arr) {
    int card = run_container_cardinality(arr);
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        rle16_t vl = arr->runs[rlepos];
        bitset_set_lenrange(answer->words, vl.value, vl.length);
    }
    answer->cardinality = card;
    return answer;
}